

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<double> __l;
  ostream *poVar1;
  double local_a0;
  double local_98;
  double folded;
  undefined1 local_88 [8];
  function<double_(double,_double)> func;
  double expectedFold;
  allocator<double> local_49;
  double local_48 [2];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> test;
  
  test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Test fold...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_48[0] = 1.0;
  local_48[1] = 1.2;
  local_38 = local_48;
  local_30 = 2;
  std::allocator<double>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l,&local_49);
  std::allocator<double>::~allocator(&local_49);
  func._M_invoker = (_Invoker_type)0x400199999999999a;
  std::function<double(double,double)>::function<main::__0,void>
            ((function<double(double,double)> *)local_88,
             (anon_class_1_0_00000001 *)((long)&folded + 7));
  local_a0 = 0.0;
  local_98 = Functional::foldLeft<std::vector<double,std::allocator<double>>,double,double>
                       ((vector<double,_std::allocator<double>_> *)local_28,
                        (function<double_(double,_double)> *)local_88,&local_a0);
  if (((double)func._M_invoker == local_98) && (!NAN((double)func._M_invoker) && !NAN(local_98))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"passed!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    std::function<double_(double,_double)>::~function((function<double_(double,_double)> *)local_88)
    ;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_28);
    return test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_;
  }
  __assert_fail("expectedFold==folded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/foldLeft/main.cpp"
                ,0x11,"int main()");
}

Assistant:

int main(){
    
  cout << "Test fold..." << endl;
  vector<double> test={1.0, 1.2};     
  double expectedFold = 2.2;
  function< double(double,double)  > func= [](double  a, double  b){return a+b;};
  auto folded = Functional::foldLeft(test, func);  
  assert(expectedFold==folded);
  cout << "passed!" << endl;
  return 0;

}